

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_bfx(DisasContext_conflict1 *s,arg_UBFX *a,_Bool u)

{
  uint ofs;
  TCGContext_conflict1 *tcg_ctx_00;
  uint len;
  int iVar1;
  TCGv_i32 ret;
  int shift;
  int width;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  _Bool u_local;
  arg_UBFX *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  len = a->widthm1 + 1;
  ofs = a->lsb;
  iVar1 = arm_dc_feature(s,6);
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else if ((int)(ofs + len) < 0x21) {
    ret = load_reg(s,a->rn);
    if (u) {
      tcg_gen_extract_i32_aarch64(tcg_ctx_00,ret,ret,ofs,len);
    }
    else {
      tcg_gen_sextract_i32_aarch64(tcg_ctx_00,ret,ret,ofs,len);
    }
    store_reg(s,a->rd,ret);
    s_local._7_1_ = true;
  }
  else {
    unallocated_encoding_aarch64(s);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool op_bfx(DisasContext *s, arg_UBFX *a, bool u)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;
    int width = a->widthm1 + 1;
    int shift = a->lsb;

    if (!ENABLE_ARCH_6T2) {
        return false;
    }
    if (shift + width > 32) {
        /* UNPREDICTABLE; we choose to UNDEF */
        unallocated_encoding(s);
        return true;
    }

    tmp = load_reg(s, a->rn);
    if (u) {
        tcg_gen_extract_i32(tcg_ctx, tmp, tmp, shift, width);
    } else {
        tcg_gen_sextract_i32(tcg_ctx, tmp, tmp, shift, width);
    }
    store_reg(s, a->rd, tmp);
    return true;
}